

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CDLSTICKSANDWICH_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_00000168;
  double *in_stack_00000170;
  double *in_stack_00000178;
  double *in_stack_00000180;
  int in_stack_0000018c;
  int in_stack_00000190;
  int *in_stack_000001a0;
  int *in_stack_000001a8;
  int *in_stack_000001b0;
  
  TVar1 = TA_CDLSTICKSANDWICH(in_stack_00000190,in_stack_0000018c,in_stack_00000180,
                              in_stack_00000178,in_stack_00000170,in_stack_00000168,
                              in_stack_000001a0,in_stack_000001a8,in_stack_000001b0);
  return TVar1;
}

Assistant:

TA_RetCode TA_CDLSTICKSANDWICH_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDLSTICKSANDWICH(
/* Generated */                          startIdx,
/* Generated */                          endIdx,
/* Generated */                          params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                          params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                          params->in[0].data.inPrice.low, /* inLow */
/* Generated */                          params->in[0].data.inPrice.close, /* inClose */
/* Generated */                          outBegIdx, 
/* Generated */                          outNBElement, 
/* Generated */                          params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }